

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinMemOutputStream.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::BinMemOutputStream::ensureCapacity(BinMemOutputStream *this,XMLSize_t extraNeeded)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t XVar2;
  XMLByte *newBuf;
  XMLSize_t newCap;
  XMLSize_t extraNeeded_local;
  BinMemOutputStream *this_local;
  XMLByte *__s;
  
  if (this->fCapacity <= this->fIndex + extraNeeded) {
    XVar2 = (this->fIndex + extraNeeded) * 2;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
    __s = (XMLByte *)CONCAT44(extraout_var,iVar1);
    memset(__s,0,XVar2 + 4);
    memcpy(__s,this->fDataBuf,this->fCapacity + 4);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fDataBuf);
    this->fDataBuf = __s;
    this->fCapacity = XVar2;
  }
  return;
}

Assistant:

void BinMemOutputStream::ensureCapacity(const XMLSize_t extraNeeded)
{
    // If we can handle it, do nothing yet
    if (fIndex + extraNeeded < fCapacity)
        return;

    // Oops, not enough room. Calc new capacity and allocate new buffer
    const XMLSize_t newCap = ((fIndex + extraNeeded) * 2);
    XMLByte* newBuf = (XMLByte*) fMemoryManager->allocate
    (
        (newCap+4) * sizeof(XMLByte)
    );

    memset(newBuf, 0, (newCap+4) * sizeof(XMLByte));

    // Copy over the old stuff
    memcpy(newBuf, fDataBuf, fCapacity * sizeof(XMLByte) + 4);

    // Clean up old buffer and store new stuff
    fMemoryManager->deallocate(fDataBuf); 
    fDataBuf = newBuf;
    fCapacity = newCap;
}